

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O2

void __thiscall TTD::SnapShot::SnapShot(SnapShot *this,double gcTime)

{
  SnapObjectVTable *pSVar1;
  
  SlabAllocatorBase<0>::SlabAllocatorBase(&this->m_slabAllocator,0x200000);
  UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::UnorderedArrayList
            (&this->m_ctxList,&this->m_slabAllocator);
  UnorderedArrayList<int,_32UL>::UnorderedArrayList
            (&this->m_tcSymbolRegistrationMapContents,&this->m_slabAllocator);
  this->m_activeScriptContext = 0;
  UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::UnorderedArrayList
            (&this->m_rootList,&this->m_slabAllocator);
  UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::UnorderedArrayList
            (&this->m_handlerList,&this->m_slabAllocator);
  UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::UnorderedArrayList
            (&this->m_typeList,&this->m_slabAllocator);
  UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::UnorderedArrayList
            (&this->m_functionBodyList,&this->m_slabAllocator);
  UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::UnorderedArrayList
            (&this->m_primitiveObjectList,&this->m_slabAllocator);
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::UnorderedArrayList
            (&this->m_compoundObjectList,&this->m_slabAllocator);
  this->m_snapObjectVTableArray = (SnapObjectVTable *)0x0;
  UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::UnorderedArrayList
            (&this->m_scopeEntries,&this->m_slabAllocator);
  UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::UnorderedArrayList
            (&this->m_slotArrayEntries,&this->m_slabAllocator);
  this->GCTime = gcTime;
  this->MarkTime = 0.0;
  this->ExtractTime = 0.0;
  pSVar1 = (SnapObjectVTable *)
           SlabAllocatorBase<0>::SlabAllocateRawSize<true,true>(&this->m_slabAllocator,0x540);
  this->m_snapObjectVTableArray = pSVar1;
  memset(pSVar1,0,0x540);
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1->InflationFunc = (fPtr_DoObjectInflation)0x0;
  pSVar1->AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1->EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar1->ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[1].InflationFunc = (fPtr_DoObjectInflation)0x0;
  pSVar1[1].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[1].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar1[1].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[2].InflationFunc = NSSnapObjects::DoObjectInflation_SnapDynamicObject;
  pSVar1[2].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar1[2].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[2].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x26].InflationFunc = NSSnapObjects::DoObjectInflation_SnapAwaitObject;
  pSVar1[0x26].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar1[0x26].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x26].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[3].InflationFunc = NSSnapObjects::DoObjectInflation_SnapExternalObject;
  pSVar1[3].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar1[3].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[3].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[4].InflationFunc = NSSnapObjects::DoObjectInflation_SnapScriptFunctionInfo;
  pSVar1[4].AddtlInstationationFunc =
       NSSnapObjects::DoAddtlValueInstantiation_SnapScriptFunctionInfo;
  pSVar1[4].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapScriptFunctionInfo;
  pSVar1[4].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapScriptFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[5].InflationFunc = (fPtr_DoObjectInflation)0x0;
  pSVar1[5].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[5].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar1[5].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[6].InflationFunc = NSSnapObjects::DoObjectInflation_SnapExternalFunctionInfo;
  pSVar1[6].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[6].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapExternalFunctionInfo;
  pSVar1[6].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapExternalFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[7].InflationFunc = NSSnapObjects::DoObjectInflation_SnapRevokerFunctionInfo;
  pSVar1[7].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[7].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapRevokerFunctionInfo;
  pSVar1[7].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapRevokerFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[8].InflationFunc = NSSnapObjects::DoObjectInflation_SnapBoundFunctionInfo;
  pSVar1[8].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[8].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapBoundFunctionInfo;
  pSVar1[8].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapBoundFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[9].InflationFunc = NSSnapObjects::DoObjectInflation_SnapActivationInfo;
  pSVar1[9].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar1[9].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[9].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[10].InflationFunc = NSSnapObjects::DoObjectInflation_SnapBlockActivationObject;
  pSVar1[10].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar1[10].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[10].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0xb].InflationFunc = NSSnapObjects::DoObjectInflation_SnapPseudoActivationObject;
  pSVar1[0xb].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar1[0xb].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0xb].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0xc].InflationFunc = NSSnapObjects::DoObjectInflation_SnapConsoleScopeActivationObject;
  pSVar1[0xc].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar1[0xc].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0xc].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0xd].InflationFunc = NSSnapObjects::DoObjectInflation_SnapHeapArgumentsInfo;
  pSVar1[0xd].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0xd].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)13>;
  pSVar1[0xd].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)13>;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0xe].InflationFunc = NSSnapObjects::DoObjectInflation_SnapES5HeapArgumentsInfo;
  pSVar1[0xe].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0xe].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)14>;
  pSVar1[0xe].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)14>;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0xf].InflationFunc = NSSnapObjects::DoObjectInflation_SnapBoxedValue;
  pSVar1[0xf].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapBoxedValue;
  pSVar1[0xf].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapBoxedValue;
  pSVar1[0xf].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapBoxedValue;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x10].InflationFunc = NSSnapObjects::DoObjectInflation_SnapDate;
  pSVar1[0x10].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x10].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapDate;
  pSVar1[0x10].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapDate;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x11].InflationFunc = NSSnapObjects::DoObjectInflation_SnapRegexInfo;
  pSVar1[0x11].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x11].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapRegexInfo;
  pSVar1[0x11].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapRegexInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x12].InflationFunc = NSSnapObjects::DoObjectInflation_SnapError;
  pSVar1[0x12].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar1[0x12].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x12].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x13].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  pSVar1[0x13].AddtlInstationationFunc =
       NSSnapObjects::
       DoAddtlValueInstantiation_SnapArrayInfo<void*,void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  pSVar1[0x13].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  pSVar1[0x13].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x14].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapArrayInfo<int,(TTD::NSSnapObjects::SnapObjectType)20>;
  pSVar1[0x14].AddtlInstationationFunc =
       NSSnapObjects::
       DoAddtlValueInstantiation_SnapArrayInfo<int,int,(TTD::NSSnapObjects::SnapObjectType)20>;
  pSVar1[0x14].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<int,(TTD::NSSnapObjects::SnapObjectType)20>;
  pSVar1[0x14].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<int,(TTD::NSSnapObjects::SnapObjectType)20>;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x15].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>
  ;
  pSVar1[0x15].AddtlInstationationFunc =
       NSSnapObjects::
       DoAddtlValueInstantiation_SnapArrayInfo<double,double,(TTD::NSSnapObjects::SnapObjectType)21>
  ;
  pSVar1[0x15].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>;
  pSVar1[0x15].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x16].InflationFunc = NSSnapObjects::DoObjectInflation_SnapES5ArrayInfo;
  pSVar1[0x16].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapES5ArrayInfo;
  pSVar1[0x16].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapES5ArrayInfo;
  pSVar1[0x16].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapES5ArrayInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x17].InflationFunc = NSSnapObjects::DoObjectInflation_SnapArrayBufferInfo;
  pSVar1[0x17].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x17].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapArrayBufferInfo;
  pSVar1[0x17].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapArrayBufferInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x18].InflationFunc = NSSnapObjects::DoObjectInflation_SnapTypedArrayInfo;
  pSVar1[0x18].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x18].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapTypedArrayInfo;
  pSVar1[0x18].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapTypedArrayInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x19].InflationFunc = NSSnapObjects::DoObjectInflation_SnapSetInfo;
  pSVar1[0x19].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapSetInfo;
  pSVar1[0x19].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapSetInfo;
  pSVar1[0x19].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapSetInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x1a].InflationFunc = NSSnapObjects::DoObjectInflation_SnapMapInfo;
  pSVar1[0x1a].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapMapInfo;
  pSVar1[0x1a].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapMapInfo;
  pSVar1[0x1a].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapMapInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x1b].InflationFunc = NSSnapObjects::DoObjectInflation_SnapProxyInfo;
  pSVar1[0x1b].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x1b].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapProxyInfo;
  pSVar1[0x1b].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapProxyInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x1c].InflationFunc = NSSnapObjects::DoObjectInflation_SnapPromiseInfo;
  pSVar1[0x1c].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x1c].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapPromiseInfo;
  pSVar1[0x1c].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapPromiseInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x1d].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapPromiseResolveOrRejectFunctionInfo;
  pSVar1[0x1d].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x1d].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo;
  pSVar1[0x1d].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x1e].InflationFunc = NSSnapObjects::DoObjectInflation_SnapPromiseReactionTaskFunctionInfo;
  pSVar1[0x1e].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x1e].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapPromiseReactionTaskFunctionInfo;
  pSVar1[0x1e].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapPromiseReactionTaskFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x1f].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo;
  pSVar1[0x1f].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x1f].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapPromiseAllResolveElementFunctionInfo;
  pSVar1[0x1f].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapPromiseAllResolveElementFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x22].InflationFunc = NSSnapObjects::DoObjectInflation_SnapGeneratorFunctionInfo;
  pSVar1[0x22].AddtlInstationationFunc =
       NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorFunctionInfo;
  pSVar1[0x22].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapGeneratorFunctionInfo;
  pSVar1[0x22].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapGeneratorFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x23].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo;
  pSVar1[0x23].AddtlInstationationFunc =
       NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorVirtualScriptFunctionInfo;
  pSVar1[0x23].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo;
  pSVar1[0x23].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x24].InflationFunc = NSSnapObjects::DoObjectInflation_SnapAsyncFunction;
  pSVar1[0x24].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapAsyncFunction;
  pSVar1[0x24].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapAsyncFunction;
  pSVar1[0x24].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapAsyncFunction;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x25].InflationFunc = NSSnapObjects::DoObjectInflation_SnapGeneratorInfo;
  pSVar1[0x25].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorInfo;
  pSVar1[0x25].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapGeneratorInfo;
  pSVar1[0x25].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapGeneratorInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x28].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo;
  pSVar1[0x28].AddtlInstationationFunc =
       NSSnapObjects::DoAddtlValueInstantiation_SnapJavascriptAsyncSpawnStepFunctionInfo;
  pSVar1[0x28].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo;
  pSVar1[0x28].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x29].InflationFunc = (fPtr_DoObjectInflation)0x0;
  pSVar1[0x29].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x29].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar1[0x29].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  return;
}

Assistant:

SnapShot::SnapShot(double gcTime)
        : m_slabAllocator(TTD_SLAB_BLOCK_ALLOCATION_SIZE_LARGE),
        m_ctxList(&this->m_slabAllocator), m_tcSymbolRegistrationMapContents(&this->m_slabAllocator), m_activeScriptContext(TTD_INVALID_LOG_PTR_ID),
        m_rootList(&this->m_slabAllocator),
        m_handlerList(&this->m_slabAllocator), m_typeList(&this->m_slabAllocator),
        m_functionBodyList(&this->m_slabAllocator), m_primitiveObjectList(&this->m_slabAllocator), m_compoundObjectList(&this->m_slabAllocator),
        m_scopeEntries(&this->m_slabAllocator), m_slotArrayEntries(&this->m_slabAllocator),
        m_snapObjectVTableArray(nullptr),
        GCTime(gcTime), MarkTime(0.0), ExtractTime(0.0)
    {
        this->m_snapObjectVTableArray = this->m_slabAllocator.SlabAllocateArray<NSSnapObjects::SnapObjectVTable>((uint32)NSSnapObjects::SnapObjectType::Limit);
        memset(this->m_snapObjectVTableArray, 0, sizeof(NSSnapObjects::SnapObjectVTable) * (uint32)NSSnapObjects::SnapObjectType::Limit);

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::Invalid] = { nullptr, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapUnhandledObject] = { nullptr, nullptr, nullptr, nullptr };

        ////
        //For the objects that have inflators

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapDynamicObject] = { &NSSnapObjects::DoObjectInflation_SnapDynamicObject, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapAwaitObject] = { &NSSnapObjects::DoObjectInflation_SnapAwaitObject, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapExternalObject] = { &NSSnapObjects::DoObjectInflation_SnapExternalObject, nullptr, nullptr, nullptr };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapScriptFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapScriptFunctionInfo, &NSSnapObjects::DoAddtlValueInstantiation_SnapScriptFunctionInfo, &NSSnapObjects::EmitAddtlInfo_SnapScriptFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapScriptFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapRuntimeFunctionObject] = { nullptr, nullptr, nullptr, nullptr }; //should always be wellknown objects and the extra state is in the functionbody defs
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapExternalFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapExternalFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapExternalFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapExternalFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapRuntimeRevokerFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapRevokerFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapRevokerFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapRevokerFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapBoundFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapBoundFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapBoundFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapBoundFunctionInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapActivationObject] = { &NSSnapObjects::DoObjectInflation_SnapActivationInfo, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapBlockActivationObject] = { &NSSnapObjects::DoObjectInflation_SnapBlockActivationObject, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPseudoActivationObject] = { &NSSnapObjects::DoObjectInflation_SnapPseudoActivationObject, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapConsoleScopeActivationObject] = { &NSSnapObjects::DoObjectInflation_SnapConsoleScopeActivationObject, nullptr, nullptr, nullptr };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapHeapArgumentsObject] = { &NSSnapObjects::DoObjectInflation_SnapHeapArgumentsInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<NSSnapObjects::SnapObjectType::SnapHeapArgumentsObject>, &NSSnapObjects::ParseAddtlInfo_SnapHeapArgumentsInfo<NSSnapObjects::SnapObjectType::SnapHeapArgumentsObject> };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapES5HeapArgumentsObject] = { &NSSnapObjects::DoObjectInflation_SnapES5HeapArgumentsInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<NSSnapObjects::SnapObjectType::SnapES5HeapArgumentsObject>, &NSSnapObjects::ParseAddtlInfo_SnapHeapArgumentsInfo<NSSnapObjects::SnapObjectType::SnapES5HeapArgumentsObject> };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapBoxedValueObject] = { &NSSnapObjects::DoObjectInflation_SnapBoxedValue, &NSSnapObjects::DoAddtlValueInstantiation_SnapBoxedValue, &NSSnapObjects::EmitAddtlInfo_SnapBoxedValue, &NSSnapObjects::ParseAddtlInfo_SnapBoxedValue };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapDateObject] = { &NSSnapObjects::DoObjectInflation_SnapDate, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapDate, &NSSnapObjects::ParseAddtlInfo_SnapDate };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapRegexObject] = { &NSSnapObjects::DoObjectInflation_SnapRegexInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapRegexInfo, &NSSnapObjects::ParseAddtlInfo_SnapRegexInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapErrorObject] = { &NSSnapObjects::DoObjectInflation_SnapError, nullptr, nullptr, nullptr };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapArrayInfo<Js::Var, NSSnapObjects::SnapObjectType::SnapArrayObject>, &NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfo<TTDVar, Js::Var, NSSnapObjects::SnapObjectType::SnapArrayObject>, &NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<TTDVar, NSSnapObjects::SnapObjectType::SnapArrayObject>, &NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<TTDVar, NSSnapObjects::SnapObjectType::SnapArrayObject> };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapArrayInfo<int32, NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject>, &NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfo<int32, int32, NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject>, &NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<int32, NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject>, &NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<int32, NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject> };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapArrayInfo<double, NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject>, &NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfo<double, double, NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject>, &NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<double, NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject>, &NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<double, NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject> };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapES5ArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapES5ArrayInfo, &NSSnapObjects::DoAddtlValueInstantiation_SnapES5ArrayInfo, &NSSnapObjects::EmitAddtlInfo_SnapES5ArrayInfo, &NSSnapObjects::ParseAddtlInfo_SnapES5ArrayInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapArrayBufferObject] = { &NSSnapObjects::DoObjectInflation_SnapArrayBufferInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapArrayBufferInfo, &NSSnapObjects::ParseAddtlInfo_SnapArrayBufferInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapTypedArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapTypedArrayInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapTypedArrayInfo, &NSSnapObjects::ParseAddtlInfo_SnapTypedArrayInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapSetObject] = { &NSSnapObjects::DoObjectInflation_SnapSetInfo, &NSSnapObjects::DoAddtlValueInstantiation_SnapSetInfo, &NSSnapObjects::EmitAddtlInfo_SnapSetInfo, &NSSnapObjects::ParseAddtlInfo_SnapSetInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapMapObject] = { &NSSnapObjects::DoObjectInflation_SnapMapInfo, &NSSnapObjects::DoAddtlValueInstantiation_SnapMapInfo, &NSSnapObjects::EmitAddtlInfo_SnapMapInfo, &NSSnapObjects::ParseAddtlInfo_SnapMapInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapProxyObject] = { &NSSnapObjects::DoObjectInflation_SnapProxyInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapProxyInfo, &NSSnapObjects::ParseAddtlInfo_SnapProxyInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPromiseObject] = { &NSSnapObjects::DoObjectInflation_SnapPromiseInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapPromiseInfo, &NSSnapObjects::ParseAddtlInfo_SnapPromiseInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPromiseResolveOrRejectFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapPromiseResolveOrRejectFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPromiseReactionTaskFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapPromiseReactionTaskFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapPromiseReactionTaskFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapPromiseReactionTaskFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPromiseAllResolveElementFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapPromiseAllResolveElementFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapPromiseAllResolveElementFunctionInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapGeneratorFunction] = {
            &NSSnapObjects::DoObjectInflation_SnapGeneratorFunctionInfo,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorFunctionInfo,
            &NSSnapObjects::EmitAddtlInfo_SnapGeneratorFunctionInfo,
            &NSSnapObjects::ParseAddtlInfo_SnapGeneratorFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapGeneratorVirtualScriptFunction] = {
            &NSSnapObjects::DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorVirtualScriptFunctionInfo,
            &NSSnapObjects::EmitAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo,
            &NSSnapObjects::ParseAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapAsyncFunction] = {
            &NSSnapObjects::DoObjectInflation_SnapAsyncFunction,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapAsyncFunction,
            &NSSnapObjects::EmitAddtlInfo_SnapAsyncFunction,
            &NSSnapObjects::ParseAddtlInfo_SnapAsyncFunction
        };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapGenerator] = {
            &NSSnapObjects::DoObjectInflation_SnapGeneratorInfo,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorInfo,
            &NSSnapObjects::EmitAddtlInfo_SnapGeneratorInfo,
            &NSSnapObjects::ParseAddtlInfo_SnapGeneratorInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::JavascriptAsyncSpawnStepFunction] = {
            &NSSnapObjects::DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapJavascriptAsyncSpawnStepFunctionInfo,
            &NSSnapObjects::EmitAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo,
            &NSSnapObjects::ParseAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo
        };



        ////
        //For the objects that are always well known

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapWellKnownObject] = { nullptr, nullptr, nullptr, nullptr };
    }